

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O1

void SetAllMatid(TPZGeoEl *gel,int matid)

{
  TPZGeoEl *this;
  
  gel->fMatId = matid;
  this = gel;
  while( true ) {
    this = TPZGeoEl::Father(this);
    if (this == (TPZGeoEl *)0x0) break;
    this->fMatId = matid;
  }
  SetSubMatid(gel,matid);
  return;
}

Assistant:

static void SetAllMatid(TPZGeoEl *gel, int matid)
{
    gel->SetMaterialId(matid);
    TPZGeoEl *fat = gel->Father();
    while (fat) {
        fat->SetMaterialId(matid);
        fat = fat->Father();
    }
    SetSubMatid(gel, matid);
}